

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

void __thiscall Arbiter_Time_Test::TestBody(Arbiter_Time_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  AssertionResult gtest_ar_1;
  Time epoch;
  Time t;
  Time x;
  Time a;
  int64_t delta;
  Time b;
  Time y;
  AssertHelper local_e0 [2];
  undefined1 local_d0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  AssertHelper local_a0;
  AssertHelper local_98;
  AssertHelper local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Time local_68 [8];
  long local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Time local_50 [8];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  arbiter::Time::Time(local_68);
  local_e0[0].data_ = (AssertHelperData *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"%Y-%m-%dT%H:%M:%SZ","");
  arbiter::Time::str((string *)&local_c0);
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"%Y-%m-%dT%H:%M:%SZ","");
  arbiter::Time::Time(local_50,(string *)&local_c0,(string *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  paVar2 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_e0[0].data_ != (AssertHelperData *)local_d0) {
    operator_delete(local_e0[0].data_);
  }
  local_e0[0].data_ = (AssertHelperData *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"%Y-%m-%dT%H:%M:%SZ","");
  arbiter::Time::str((string *)&local_c0);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"%Y-%m-%dT%H:%M:%SZ","");
  arbiter::Time::str((string *)&local_88);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_60,"a.str()","b.str()",&local_c0,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_e0[0].data_ != (AssertHelperData *)local_d0) {
    operator_delete(local_e0[0].data_);
  }
  if (local_60._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x24,pcVar5);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((long *)local_c0._M_dataplus._M_p != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_c0._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_c0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e0[0].data_ = (AssertHelperData *)arbiter::Time::operator-(local_68,local_50);
  local_88._M_dataplus._M_p = local_88._M_dataplus._M_p & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_c0,"a - b","0",(long *)local_e0,(int *)&local_88);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_e0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x25,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (local_e0[0].data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_e0[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_e0[0].data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"2016-03-18T03:14:42Z","");
  local_e0[0].data_ = (AssertHelperData *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"%Y-%m-%dT%H:%M:%SZ","");
  arbiter::Time::Time((Time *)&local_88,(string *)&local_c0,(string *)local_e0);
  if (local_e0[0].data_ != (AssertHelperData *)local_d0) {
    operator_delete(local_e0[0].data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"2016-03-18T04:24:54Z","");
  local_e0[0].data_ = (AssertHelperData *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"%Y-%m-%dT%H:%M:%SZ","");
  arbiter::Time::Time((Time *)local_48,(string *)&local_c0,(string *)local_e0);
  if (local_e0[0].data_ != (AssertHelperData *)local_d0) {
    operator_delete(local_e0[0].data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_60 = 0x1074;
  local_e0[0].data_ =
       (AssertHelperData *)arbiter::Time::operator-((Time *)local_48,(Time *)&local_88);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_c0,"y - x","delta",(long *)local_e0,&local_60);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_e0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x2b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_e0[0].data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_e0[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_e0[0].data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e0[0].data_ =
       (AssertHelperData *)arbiter::Time::operator-((Time *)&local_88,(Time *)local_48);
  local_a0.data_ = (AssertHelperData *)0xffffffffffffef8c;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_c0,"x - y","-delta",(long *)local_e0,(long *)&local_a0);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_e0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x2c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_e0[0].data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_e0[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_e0[0].data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"1970-01-01T00:00:00Z","");
  local_e0[0].data_ = (AssertHelperData *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"%Y-%m-%dT%H:%M:%SZ","");
  arbiter::Time::Time((Time *)&local_a0,(string *)&local_c0,(string *)local_e0);
  if (local_e0[0].data_ != (AssertHelperData *)local_d0) {
    operator_delete(local_e0[0].data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_e0[0].data_ = (AssertHelperData *)arbiter::Time::asUnix();
  local_98.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_c0,"epoch.asUnix()","0",(long *)local_e0,(int *)&local_98);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_e0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x2f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_e0[0].data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_e0[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_e0[0].data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"2019-01-03T17:39:11Z","");
  local_e0[0].data_ = (AssertHelperData *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"%Y-%m-%dT%H:%M:%SZ","");
  arbiter::Time::Time((Time *)&local_98,(string *)&local_c0,(string *)local_e0);
  if (local_e0[0].data_ != (AssertHelperData *)local_d0) {
    operator_delete(local_e0[0].data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  lVar4 = arbiter::Time::asUnix();
  local_e0[0].data_ = (AssertHelperData *)(lVar4 + -0x5c2e48bf);
  local_90.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_c0,"t.asUnix() - 1546537151","0",(long *)local_e0,(int *)&local_90);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_e0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x34,pcVar5);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_e0[0].data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_e0[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_e0[0].data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Arbiter, Time)
{
    Time a;
    Time b(a.str());

    EXPECT_EQ(a.str(), b.str());
    EXPECT_EQ(a - b, 0);

    Time x("2016-03-18T03:14:42Z");
    Time y("2016-03-18T04:24:54Z");
    const int64_t delta(1 * 60 * 60 + 10 * 60 + 12);

    EXPECT_EQ(y - x, delta);
    EXPECT_EQ(x - y, -delta);

    Time epoch("1970-01-01T00:00:00Z");
    EXPECT_EQ(epoch.asUnix(), 0);

    // Issue 23.
    {
        Time t("2019-01-03T17:39:11Z");
        EXPECT_EQ(t.asUnix() - 1546537151, 0);
    }
}